

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  int iVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ushort uVar10;
  uint uVar11;
  long lVar12;
  stbi_uc *psVar13;
  stbi_uc sVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  char *zout;
  int iVar19;
  int iVar20;
  long lVar21;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar2 = a->zbuffer;
    uVar11 = 0;
    uVar5 = 0;
    if (pbVar2 < a->zbuffer_end) {
      a->zbuffer = pbVar2 + 1;
      uVar5 = (uint)*pbVar2;
    }
    pbVar2 = a->zbuffer;
    if (pbVar2 < a->zbuffer_end) {
      a->zbuffer = pbVar2 + 1;
      uVar11 = (uint)*pbVar2;
    }
    if (((0x8421084 < (uVar5 << 8 | uVar11) * -0x42108421) || ((uVar11 & 0x20) != 0)) ||
       ((uVar5 & 0xf) != 8)) {
LAB_001175ff:
      stbi__g_failure_reason = "Corrupt PNG";
      return 0;
    }
  }
  a->num_bits = 0;
  a->code_buffer = 0;
  do {
    if (a->num_bits < 1) {
      stbi__fill_bits(a);
    }
    iVar8 = a->num_bits;
    uVar5 = a->code_buffer;
    a->code_buffer = uVar5 >> 1;
    a->num_bits = iVar8 + -1;
    if (iVar8 < 3) {
      stbi__fill_bits(a);
    }
    iVar8 = a->num_bits;
    uVar11 = a->code_buffer;
    a->code_buffer = uVar11 >> 2;
    a->num_bits = iVar8 - 2U;
    iVar19 = 0;
    switch(uVar11 & 3) {
    case 0:
      uVar11 = iVar8 - 2U & 7;
      if (uVar11 != 0) {
        if (iVar8 < 2) {
          stbi__fill_bits(a);
        }
        a->code_buffer = a->code_buffer >> (sbyte)uVar11;
        a->num_bits = a->num_bits - uVar11;
      }
      iVar8 = a->num_bits;
      if (iVar8 < 1) {
        uVar9 = 0;
      }
      else {
        uVar11 = a->code_buffer;
        uVar9 = 0;
        iVar19 = iVar8;
        do {
          *(char *)((long)local_814.fast + uVar9) = (char)uVar11;
          uVar9 = uVar9 + 1;
          uVar11 = uVar11 >> 8;
          iVar8 = iVar19 + -8;
          bVar4 = 8 < iVar19;
          iVar19 = iVar8;
        } while (bVar4);
        a->code_buffer = uVar11;
        a->num_bits = iVar8;
      }
      if (iVar8 != 0) {
        __assert_fail("a->num_bits == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                      ,0xfc1,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
      }
      if ((uint)uVar9 < 4) {
        psVar13 = a->zbuffer;
        psVar3 = a->zbuffer_end;
        uVar9 = uVar9 & 0xffffffff;
        do {
          if (psVar13 < psVar3) {
            a->zbuffer = psVar13 + 1;
            sVar14 = *psVar13;
            psVar13 = psVar13 + 1;
          }
          else {
            sVar14 = '\0';
          }
          *(stbi_uc *)((long)local_814.fast + uVar9) = sVar14;
          uVar9 = uVar9 + 1;
        } while (uVar9 != 4);
      }
      if (((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) &&
         (uVar9 = (ulong)local_814.fast[0], a->zbuffer + uVar9 <= a->zbuffer_end)) {
        if ((a->zout_end < a->zout + uVar9) &&
           (iVar8 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar8 == 0)) {
          return 0;
        }
        memcpy(a->zout,a->zbuffer,uVar9);
        a->zbuffer = a->zbuffer + uVar9;
        a->zout = a->zout + uVar9;
        goto LAB_001175ed;
      }
      goto LAB_001175ff;
    case 1:
      iVar8 = stbi__zbuild_huffman
                        (&a->z_length,
                         "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                         ,0x120);
      if (iVar8 == 0) {
        return 0;
      }
      iVar8 = stbi__zbuild_huffman
                        (&a->z_distance,
                         "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                         ,0x20);
      uVar11 = uVar5;
      break;
    case 2:
      if (iVar8 < 7) {
        stbi__fill_bits(a);
      }
      iVar8 = a->num_bits;
      uVar11 = a->code_buffer;
      a->code_buffer = uVar11 >> 5;
      a->num_bits = iVar8 + -5;
      if (iVar8 < 10) {
        stbi__fill_bits(a);
      }
      iVar8 = a->num_bits;
      uVar18 = a->code_buffer;
      a->code_buffer = uVar18 >> 5;
      a->num_bits = iVar8 + -5;
      if (iVar8 < 9) {
        stbi__fill_bits(a);
      }
      uVar11 = uVar11 & 0x1f;
      iVar8 = uVar11 + 0x101;
      iVar19 = (uVar18 & 0x1f) + 1;
      uVar18 = a->code_buffer;
      a->code_buffer = uVar18 >> 4;
      a->num_bits = a->num_bits + -4;
      local_a08 = 0;
      uStack_a00 = 0;
      uStack_9f9 = 0;
      lVar21 = 0;
      do {
        if (a->num_bits < 3) {
          stbi__fill_bits(a);
        }
        uVar7 = a->code_buffer;
        a->code_buffer = uVar7 >> 3;
        a->num_bits = a->num_bits + -3;
        *(byte *)((long)&local_a08 +
                 (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar21])
             = (byte)uVar7 & 7;
        lVar21 = lVar21 + 1;
      } while ((ulong)(uVar18 & 0xf) + 4 != lVar21);
      iVar6 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
      if (iVar6 == 0) {
        return 0;
      }
      iVar6 = iVar19 + iVar8;
      iVar20 = 0;
      while( true ) {
        if (iVar6 <= iVar20) break;
        if (a->num_bits < 0x10) {
          stbi__fill_bits(a);
        }
        uVar18 = a->code_buffer;
        uVar10 = local_814.fast[uVar18 & 0x1ff];
        if (uVar10 == 0) {
          uVar10 = (ushort)uVar18 << 8 | (ushort)uVar18 >> 8;
          uVar7 = (uVar10 & 0xf0f) << 4 | (uVar10 & 0xf0f0) >> 4;
          uVar7 = (uVar7 >> 2 & 0x3333) + (uVar7 & 0x3333) * 4;
          uVar7 = (uVar7 >> 1 & 0x5555) + (uVar7 & 0x5555) * 2;
          lVar21 = 0;
          do {
            lVar12 = lVar21;
            lVar21 = lVar12 + 1;
          } while (local_814.maxcode[lVar12 + 10] <= (int)uVar7);
          uVar15 = 0xffffffff;
          if (lVar21 != 7) {
            lVar16 = (ulong)local_814.firstsymbol[lVar12 + 10] +
                     ((ulong)(uVar7 >> (7U - (char)lVar21 & 0x1f)) -
                     (ulong)local_814.firstcode[lVar12 + 10]);
            if ((ulong)*(byte *)((long)&local_814 + lVar16 + 0x484) - 9 != lVar21)
            goto LAB_00117625;
            a->code_buffer = uVar18 >> ((char)lVar12 + 10U & 0x1f);
            a->num_bits = (a->num_bits - (int)lVar21) + -9;
            uVar15 = (uint)*(ushort *)((long)&local_814 + lVar16 * 2 + 0x5a4);
          }
        }
        else {
          a->code_buffer = uVar18 >> ((byte)(uVar10 >> 9) & 0x1f);
          a->num_bits = a->num_bits - (uint)(uVar10 >> 9);
          uVar15 = uVar10 & 0x1ff;
        }
        if (uVar15 < 0x13) {
          if ((int)uVar15 < 0x10) {
            lVar21 = (long)iVar20;
            iVar20 = iVar20 + 1;
            abStack_9e9[lVar21 + 1] = (char)uVar15;
          }
          else {
            iVar1 = a->num_bits;
            if (uVar15 == 0x11) {
              if (iVar1 < 3) {
                stbi__fill_bits(a);
              }
              uVar18 = a->code_buffer;
              a->code_buffer = uVar18 >> 3;
              a->num_bits = a->num_bits + -3;
              uVar18 = (uVar18 & 7) + 3;
LAB_00117120:
              uVar7 = 0;
            }
            else {
              if (uVar15 != 0x10) {
                if (iVar1 < 7) {
                  stbi__fill_bits(a);
                }
                uVar18 = a->code_buffer;
                a->code_buffer = uVar18 >> 7;
                a->num_bits = a->num_bits + -7;
                uVar18 = (uVar18 & 0x7f) + 0xb;
                goto LAB_00117120;
              }
              if (iVar1 < 2) {
                stbi__fill_bits(a);
              }
              uVar18 = a->code_buffer;
              a->code_buffer = uVar18 >> 2;
              a->num_bits = a->num_bits + -2;
              if (iVar20 == 0) {
                iVar20 = 0;
                goto LAB_0011706e;
              }
              uVar18 = (uVar18 & 3) + 3;
              uVar7 = (uint)abStack_9e9[iVar20];
            }
            if (iVar6 - iVar20 < (int)uVar18) goto LAB_0011706e;
            memset(abStack_9e9 + (long)iVar20 + 1,uVar7,(ulong)uVar18);
            iVar20 = iVar20 + uVar18;
          }
          bVar4 = true;
        }
        else {
LAB_0011706e:
          stbi__g_failure_reason = "Corrupt PNG";
          bVar4 = false;
        }
        if (!bVar4) {
          return 0;
        }
      }
      if (iVar6 != iVar20) goto LAB_001175ff;
      iVar8 = stbi__zbuild_huffman(&a->z_length,(stbi_uc *)((long)abStack_9e9 + 1),iVar8);
      if (iVar8 == 0) {
        return 0;
      }
      iVar8 = stbi__zbuild_huffman(&a->z_distance,asStack_8e7 + uVar11,iVar19);
      uVar11 = 0;
      break;
    case 3:
      goto switchD_00116dd2_caseD_3;
    }
    if (iVar8 == 0) {
      return 0;
    }
    zout = a->zout;
    do {
      if (a->num_bits < 0x10) {
        stbi__fill_bits(a);
      }
      uVar18 = a->code_buffer;
      uVar10 = (a->z_length).fast[uVar18 & 0x1ff];
      if (uVar10 == 0) {
        uVar10 = (ushort)uVar18 << 8 | (ushort)uVar18 >> 8;
        uVar7 = (uVar10 & 0xf0f) << 4 | (uVar10 & 0xf0f0) >> 4;
        uVar7 = (uVar7 >> 2 & 0x3333) + (uVar7 & 0x3333) * 4;
        uVar7 = (uVar7 >> 1 & 0x5555) + (uVar7 & 0x5555) * 2;
        lVar21 = 0;
        do {
          lVar12 = lVar21;
          lVar21 = lVar12 + 1;
        } while ((a->z_length).maxcode[lVar12 + 10] <= (int)uVar7);
        uVar15 = 0xffffffff;
        if (lVar21 != 7) {
          lVar16 = (ulong)(a->z_length).firstsymbol[lVar12 + 10] +
                   ((ulong)(uVar7 >> (7U - (char)lVar21 & 0x1f)) -
                   (ulong)(a->z_length).firstcode[lVar12 + 10]);
          if ((ulong)*(byte *)((long)a + lVar16 + 0x4b8) - 9 != lVar21) {
LAB_00117625:
            __assert_fail("z->size[b] == s",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                          ,0xf24,
                          "int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
          }
          a->code_buffer = uVar18 >> ((char)lVar12 + 10U & 0x1f);
          a->num_bits = (a->num_bits - (int)lVar21) + -9;
          uVar15 = (uint)*(ushort *)((long)a + lVar16 * 2 + 0x5d8);
        }
      }
      else {
        a->code_buffer = uVar18 >> ((byte)(uVar10 >> 9) & 0x1f);
        a->num_bits = a->num_bits - (uint)(uVar10 >> 9);
        uVar15 = uVar10 & 0x1ff;
      }
      if ((int)uVar15 < 0x100) {
        if ((int)uVar15 < 0) {
LAB_0011749a:
          stbi__g_failure_reason = "Corrupt PNG";
LAB_001174a8:
          bVar4 = false;
          uVar11 = 0;
        }
        else {
          if (a->zout_end <= zout) {
            iVar8 = stbi__zexpand(a,zout,1);
            if (iVar8 == 0) goto LAB_001174a8;
            zout = a->zout;
          }
          *zout = (char)uVar15;
          zout = zout + 1;
          bVar4 = true;
        }
      }
      else if (uVar15 == 0x100) {
        a->zout = zout;
        uVar11 = 1;
        bVar4 = false;
      }
      else {
        uVar9 = (ulong)(uVar15 - 0x101);
        uVar18 = stbi__zlength_base[uVar9];
        if (0xffffffffffffffeb < uVar9 - 0x1c) {
          iVar8 = stbi__zlength_extra[uVar9];
          if (a->num_bits < iVar8) {
            stbi__fill_bits(a);
          }
          uVar7 = a->code_buffer;
          a->code_buffer = uVar7 >> ((byte)iVar8 & 0x1f);
          a->num_bits = a->num_bits - iVar8;
          uVar18 = uVar18 + (~(-1 << ((byte)iVar8 & 0x1f)) & uVar7);
        }
        if (a->num_bits < 0x10) {
          stbi__fill_bits(a);
        }
        uVar7 = a->code_buffer;
        uVar10 = (a->z_distance).fast[uVar7 & 0x1ff];
        if (uVar10 == 0) {
          uVar10 = (ushort)uVar7 << 8 | (ushort)uVar7 >> 8;
          uVar15 = (uVar10 & 0xf0f) << 4 | (uVar10 & 0xf0f0) >> 4;
          uVar15 = (uVar15 >> 2 & 0x3333) + (uVar15 & 0x3333) * 4;
          uVar15 = (uVar15 >> 1 & 0x5555) + (uVar15 & 0x5555) * 2;
          lVar21 = 0;
          do {
            lVar12 = lVar21;
            lVar21 = lVar12 + 1;
          } while ((a->z_distance).maxcode[lVar12 + 10] <= (int)uVar15);
          uVar17 = 0xffffffff;
          if (lVar21 != 7) {
            lVar16 = (ulong)(a->z_distance).firstsymbol[lVar12 + 10] +
                     ((ulong)(uVar15 >> (7U - (char)lVar21 & 0x1f)) -
                     (ulong)(a->z_distance).firstcode[lVar12 + 10]);
            if ((ulong)*(byte *)((long)a + lVar16 + 0xc9c) - 9 != lVar21) goto LAB_00117625;
            a->code_buffer = uVar7 >> ((char)lVar12 + 10U & 0x1f);
            a->num_bits = (a->num_bits - (int)lVar21) + -9;
            uVar17 = (uint)*(ushort *)((long)a + lVar16 * 2 + 0xdbc);
          }
        }
        else {
          a->code_buffer = uVar7 >> ((byte)(uVar10 >> 9) & 0x1f);
          a->num_bits = a->num_bits - (uint)(uVar10 >> 9);
          uVar17 = uVar10 & 0x1ff;
        }
        if ((int)uVar17 < 0) goto LAB_0011749a;
        uVar9 = (ulong)uVar17;
        iVar8 = stbi__zdist_base[uVar9];
        if (0xffffffffffffffe5 < uVar9 - 0x1e) {
          iVar19 = stbi__zdist_extra[uVar9];
          if (a->num_bits < iVar19) {
            stbi__fill_bits(a);
          }
          uVar7 = a->code_buffer;
          a->code_buffer = uVar7 >> ((byte)iVar19 & 0x1f);
          a->num_bits = a->num_bits - iVar19;
          iVar8 = iVar8 + (~(-1 << ((byte)iVar19 & 0x1f)) & uVar7);
        }
        if ((long)zout - (long)a->zout_start < (long)iVar8) {
          stbi__g_failure_reason = "Corrupt PNG";
LAB_0011748d:
          bVar4 = false;
          uVar11 = 0;
        }
        else {
          if (a->zout_end < zout + (int)uVar18) {
            iVar19 = stbi__zexpand(a,zout,uVar18);
            if (iVar19 == 0) goto LAB_0011748d;
            zout = a->zout;
          }
          lVar21 = -(long)iVar8;
          bVar4 = true;
          if (iVar8 == 1) {
            if (uVar18 != 0) {
              memset(zout,(uint)(byte)zout[lVar21],(ulong)uVar18);
              zout = zout + (ulong)(uVar18 - 1) + 1;
            }
          }
          else {
            for (; uVar18 != 0; uVar18 = uVar18 - 1) {
              *zout = zout[lVar21];
              zout = zout + 1;
            }
          }
        }
      }
    } while (bVar4);
    if (uVar11 == 0) {
      return 0;
    }
LAB_001175ed:
    if ((uVar5 & 1) != 0) {
      iVar19 = 1;
switchD_00116dd2_caseD_3:
      return iVar19;
    }
  } while( true );
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}